

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

int statecmp(config *a,config *b)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  
  uVar1 = (uint)(a != (config *)0x0);
  bVar4 = b != (config *)0x0;
  if (a != (config *)0x0 && bVar4) {
    do {
      uVar3 = a->rp->index - b->rp->index;
      if (uVar3 == 0) {
        uVar3 = a->dot - b->dot;
      }
      a = a->bp;
      b = b->bp;
      uVar1 = (uint)(a != (config *)0x0);
      bVar4 = b != (config *)0x0;
      bVar5 = uVar3 == 0;
    } while (((bVar5) && (a != (config *)0x0)) && (b != (config *)0x0));
  }
  else {
    bVar5 = true;
    uVar3 = 0;
  }
  uVar2 = 0xffffffff;
  if (!bVar4) {
    uVar2 = uVar1;
  }
  if (!bVar5) {
    uVar2 = uVar3;
  }
  return uVar2;
}

Assistant:

PRIVATE int statecmp(struct config *a, struct config *b)
{
  int rc;
  for(rc=0; rc==0 && a && b;  a=a->bp, b=b->bp){
    rc = a->rp->index - b->rp->index;
    if( rc==0 ) rc = a->dot - b->dot;
  }
  if( rc==0 ){
    if( a ) rc = 1;
    if( b ) rc = -1;
  }
  return rc;
}